

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O3

void __thiscall deqp::sl::ShaderParser::advanceToken(ShaderParser *this)

{
  string *this_00;
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  size_t __n;
  int iVar4;
  byte bVar5;
  byte *pbVar6;
  long lVar7;
  byte *__s2;
  byte *pbVar8;
  long *local_50 [2];
  long local_40 [2];
  
  this_00 = &this->m_curTokenStr;
  pcVar2 = (char *)(this->m_curTokenStr)._M_string_length;
  this->m_curPtr = this->m_curPtr + (long)pcVar2;
  this->m_curToken = TOKEN_INVALID;
  std::__cxx11::string::_M_replace((ulong)this_00,0,pcVar2,0x1af8059);
  __s2 = (byte *)this->m_curPtr;
  while( true ) {
    bVar1 = *__s2;
    uVar3 = (ulong)bVar1;
    if (0x23 < uVar3) break;
    if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
      if (uVar3 != 0x23) {
        if (uVar3 == 0) {
          this->m_curToken = TOKEN_EOF;
          std::__cxx11::string::_M_replace
                    ((ulong)this_00,0,(char *)(this->m_curTokenStr)._M_string_length,0x1b85f9f);
          return;
        }
        break;
      }
      while ((pbVar8 = __s2 + 1, 0xd < (byte)uVar3 || ((0x2401U >> ((uint)uVar3 & 0x1f) & 1) == 0)))
      {
        this->m_curPtr = (char *)pbVar8;
        uVar3 = (ulong)*pbVar8;
        __s2 = pbVar8;
      }
    }
    else {
      __s2 = __s2 + 1;
      this->m_curPtr = (char *)__s2;
    }
  }
  pbVar8 = __s2;
  if (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5)) {
    do {
      do {
        pbVar8 = pbVar8 + 1;
        bVar1 = *pbVar8;
      } while ((byte)(bVar1 - 0x30) < 10);
    } while (((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) ||
            ((bVar1 - 0x2d < 0x33 && ((0x4000000000003U >> ((ulong)(bVar1 - 0x2d) & 0x3f) & 1) != 0)
             )));
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s2);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    this->m_curToken = TOKEN_IDENTIFIER;
    lVar7 = 8;
    do {
      iVar4 = std::__cxx11::string::compare((char *)this_00);
      if (iVar4 == 0) {
        this->m_curToken = *(Token *)((long)&advanceToken::s_named[0].str + lVar7);
        return;
      }
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x288);
    return;
  }
  if (0xf5 < (byte)(bVar1 - 0x3a)) {
    do {
      pbVar6 = pbVar8;
      pbVar8 = pbVar6 + 1;
    } while (0xf5 < (byte)(*pbVar6 - 0x3a));
    if (*pbVar6 == 0x2e) {
      do {
        pbVar6 = pbVar8;
        pbVar8 = pbVar6 + 1;
      } while (0xf5 < (byte)(*pbVar6 - 0x3a));
      if ((*pbVar6 | 0x20) == 0x65) {
        if ((*pbVar8 == 0x2b) || (*pbVar8 == 0x2d)) {
          pbVar8 = pbVar6 + 2;
        }
        pbVar6 = pbVar8 + -1;
        do {
          pbVar8 = pbVar6 + 1;
          pbVar6 = pbVar6 + 1;
        } while (0xf5 < (byte)(*pbVar8 - 0x3a));
      }
      this->m_curToken = TOKEN_FLOAT_LITERAL;
    }
    else {
      this->m_curToken = TOKEN_INT_LITERAL;
    }
    goto LAB_00da438a;
  }
  if (bVar1 == 0x22) {
    bVar5 = __s2[1];
    if (bVar5 != 0x22) goto LAB_00da429d;
    for (pbVar8 = __s2 + 2; (*pbVar8 != 0x22 || (pbVar8[1] != 0x22));
        pbVar8 = pbVar8 + (ulong)(*pbVar8 == 0x5c) + 1) {
    }
    this->m_curToken = TOKEN_SHADER_SOURCE;
    iVar4 = ((int)pbVar8 - (int)__s2) + 2;
  }
  else {
    if (bVar1 != 0x27) {
      lVar7 = 8;
      do {
        pcVar2 = *(char **)((long)&advanceToken::s_named[0x27].token + lVar7);
        __n = strlen(pcVar2);
        iVar4 = strncmp(pcVar2,(char *)__s2,__n);
        if (iVar4 == 0) {
          this->m_curToken = *(Token *)((long)&advanceToken::s_simple[0].str + lVar7);
          std::__cxx11::string::operator=((string *)this_00,pcVar2);
          return;
        }
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 200);
      this->m_curToken = TOKEN_INVALID;
      std::__cxx11::string::_M_replace_aux
                ((ulong)this_00,0,(this->m_curTokenStr)._M_string_length,'\x01');
      return;
    }
    bVar5 = __s2[1];
LAB_00da429d:
    pbVar8 = __s2 + 1;
    while (bVar5 != bVar1) {
      pbVar8 = pbVar8 + (ulong)(bVar5 == 0x5c) + 1;
      bVar5 = *pbVar8;
    }
    this->m_curToken = TOKEN_STRING;
    iVar4 = ((int)pbVar8 - (int)__s2) + 1;
  }
  pbVar6 = __s2 + iVar4;
LAB_00da438a:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s2,pbVar6);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void ShaderParser::advanceToken(void)
{
	// Skip old token.
	m_curPtr += m_curTokenStr.length();

	// Reset token (for safety).
	m_curToken	= TOKEN_INVALID;
	m_curTokenStr = "";

	// Eat whitespace & comments while they last.
	for (;;)
	{
		while (isWhitespace(*m_curPtr))
			m_curPtr++;

		// Check for EOL comment.
		if (*m_curPtr == '#')
		{
			while (*m_curPtr && !isEOL(*m_curPtr))
				m_curPtr++;
		}
		else
			break;
	}

	if (!*m_curPtr)
	{
		m_curToken	= TOKEN_EOF;
		m_curTokenStr = "<EOF>";
	}
	else if (isAlpha(*m_curPtr))
	{
		struct Named
		{
			const char* str;
			Token		token;
		};

		static const Named s_named[] = { { "true", TOKEN_TRUE },
										 { "false", TOKEN_FALSE },
										 { "desc", TOKEN_DESC },
										 { "expect", TOKEN_EXPECT },
										 { "group", TOKEN_GROUP },
										 { "case", TOKEN_CASE },
										 { "end", TOKEN_END },
										 { "values", TOKEN_VALUES },
										 { "both", TOKEN_BOTH },
										 { "vertex", TOKEN_VERTEX },
										 { "fragment", TOKEN_FRAGMENT },
										 { "uniform", TOKEN_UNIFORM },
										 { "input", TOKEN_INPUT },
										 { "output", TOKEN_OUTPUT },
										 { "float", TOKEN_FLOAT },
										 { "vec2", TOKEN_FLOAT_VEC2 },
										 { "vec3", TOKEN_FLOAT_VEC3 },
										 { "vec4", TOKEN_FLOAT_VEC4 },
										 { "mat2", TOKEN_FLOAT_MAT2 },
										 { "mat2x3", TOKEN_FLOAT_MAT2X3 },
										 { "mat2x4", TOKEN_FLOAT_MAT2X4 },
										 { "mat3x2", TOKEN_FLOAT_MAT3X2 },
										 { "mat3", TOKEN_FLOAT_MAT3 },
										 { "mat3x4", TOKEN_FLOAT_MAT3X4 },
										 { "mat4x2", TOKEN_FLOAT_MAT4X2 },
										 { "mat4x3", TOKEN_FLOAT_MAT4X3 },
										 { "mat4", TOKEN_FLOAT_MAT4 },
										 { "int", TOKEN_INT },
										 { "ivec2", TOKEN_INT_VEC2 },
										 { "ivec3", TOKEN_INT_VEC3 },
										 { "ivec4", TOKEN_INT_VEC4 },
										 { "uint", TOKEN_UINT },
										 { "uvec2", TOKEN_UINT_VEC2 },
										 { "uvec3", TOKEN_UINT_VEC3 },
										 { "uvec4", TOKEN_UINT_VEC4 },
										 { "bool", TOKEN_BOOL },
										 { "bvec2", TOKEN_BOOL_VEC2 },
										 { "bvec3", TOKEN_BOOL_VEC3 },
										 { "bvec4", TOKEN_BOOL_VEC4 },
										 { "version", TOKEN_VERSION } };

		const char* end = m_curPtr + 1;
		while (isCaseNameChar(*end))
			end++;
		m_curTokenStr = string(m_curPtr, end - m_curPtr);

		m_curToken = TOKEN_IDENTIFIER;

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_named); ndx++)
		{
			if (m_curTokenStr == s_named[ndx].str)
			{
				m_curToken = s_named[ndx].token;
				break;
			}
		}
	}
	else if (isNumeric(*m_curPtr))
	{
		/* \todo [2010-03-31 petri] Hex? */
		const char* p = m_curPtr;
		while (isNumeric(*p))
			p++;
		if (*p == '.')
		{
			p++;
			while (isNumeric(*p))
				p++;

			if (*p == 'e' || *p == 'E')
			{
				p++;
				if (*p == '+' || *p == '-')
					p++;
				DE_ASSERT(isNumeric(*p));
				while (isNumeric(*p))
					p++;
			}

			m_curToken	= TOKEN_FLOAT_LITERAL;
			m_curTokenStr = string(m_curPtr, p - m_curPtr);
		}
		else
		{
			m_curToken	= TOKEN_INT_LITERAL;
			m_curTokenStr = string(m_curPtr, p - m_curPtr);
		}
	}
	else if (*m_curPtr == '"' && m_curPtr[1] == '"')
	{
		const char* p = m_curPtr + 2;

		while ((p[0] != '"') || (p[1] != '"'))
		{
			DE_ASSERT(*p);
			if (*p == '\\')
			{
				DE_ASSERT(p[1] != 0);
				p += 2;
			}
			else
				p++;
		}
		p += 2;

		m_curToken	= TOKEN_SHADER_SOURCE;
		m_curTokenStr = string(m_curPtr, (int)(p - m_curPtr));
	}
	else if (*m_curPtr == '"' || *m_curPtr == '\'')
	{
		char		endChar = *m_curPtr;
		const char* p		= m_curPtr + 1;

		while (*p != endChar)
		{
			DE_ASSERT(*p);
			if (*p == '\\')
			{
				DE_ASSERT(p[1] != 0);
				p += 2;
			}
			else
				p++;
		}
		p++;

		m_curToken	= TOKEN_STRING;
		m_curTokenStr = string(m_curPtr, (int)(p - m_curPtr));
	}
	else
	{
		struct SimpleToken
		{
			const char* str;
			Token		token;
		};

		static const SimpleToken s_simple[] = { { "=", TOKEN_ASSIGN },		 { "+", TOKEN_PLUS },
												{ "-", TOKEN_MINUS },		 { ",", TOKEN_COMMA },
												{ "|", TOKEN_VERTICAL_BAR }, { ";", TOKEN_SEMI_COLON },
												{ "(", TOKEN_LEFT_PAREN },   { ")", TOKEN_RIGHT_PAREN },
												{ "[", TOKEN_LEFT_BRACKET }, { "]", TOKEN_RIGHT_BRACKET },
												{ "{", TOKEN_LEFT_BRACE },   { "}", TOKEN_RIGHT_BRACE } };

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_simple); ndx++)
		{
			if (strncmp(s_simple[ndx].str, m_curPtr, strlen(s_simple[ndx].str)) == 0)
			{
				m_curToken	= s_simple[ndx].token;
				m_curTokenStr = s_simple[ndx].str;
				return;
			}
		}

		// Otherwise invalid token.
		m_curToken	= TOKEN_INVALID;
		m_curTokenStr = *m_curPtr;
	}
}